

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O3

void gjkepa2_impl::Initialize
               (cbtConvexShape *shape0,cbtTransform *wtrs0,cbtConvexShape *shape1,
               cbtTransform *wtrs1,sResults *results,tShape *shape,bool withmargins)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  undefined8 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  code *pcVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  results->witnesses[1].m_floats[3] = 0.0;
  results->status = Separated;
  results->witnesses[0].m_floats[0] = 0.0;
  results->witnesses[0].m_floats[1] = 0.0;
  results->witnesses[0].m_floats[2] = 0.0;
  *(undefined8 *)(results->witnesses[0].m_floats + 3) = 0;
  results->witnesses[1].m_floats[1] = 0.0;
  results->witnesses[1].m_floats[2] = 0.0;
  shape->m_shapes[0] = shape0;
  shape->m_shapes[1] = shape1;
  fVar1 = (wtrs1->m_basis).m_el[1].m_floats[0];
  fVar2 = (wtrs1->m_basis).m_el[1].m_floats[1];
  fVar3 = (wtrs1->m_basis).m_el[1].m_floats[2];
  fVar4 = (wtrs0->m_basis).m_el[1].m_floats[2];
  cVar5 = (wtrs1->m_basis).m_el[0].m_floats[0];
  auVar12._4_4_ = cVar5;
  auVar12._0_4_ = cVar5;
  auVar12._8_4_ = cVar5;
  auVar12._12_4_ = cVar5;
  cVar5 = (wtrs1->m_basis).m_el[0].m_floats[1];
  auVar25._4_4_ = cVar5;
  auVar25._0_4_ = cVar5;
  auVar25._8_4_ = cVar5;
  auVar25._12_4_ = cVar5;
  cVar5 = (wtrs1->m_basis).m_el[0].m_floats[2];
  auVar28._4_4_ = cVar5;
  auVar28._0_4_ = cVar5;
  auVar28._8_4_ = cVar5;
  auVar28._12_4_ = cVar5;
  cVar5 = (wtrs0->m_basis).m_el[0].m_floats[2];
  cVar6 = (wtrs1->m_basis).m_el[2].m_floats[0];
  auVar21._4_4_ = cVar6;
  auVar21._0_4_ = cVar6;
  auVar21._8_4_ = cVar6;
  auVar21._12_4_ = cVar6;
  cVar6 = (wtrs1->m_basis).m_el[2].m_floats[1];
  auVar27._4_4_ = cVar6;
  auVar27._0_4_ = cVar6;
  auVar27._8_4_ = cVar6;
  auVar27._12_4_ = cVar6;
  cVar6 = (wtrs1->m_basis).m_el[2].m_floats[2];
  auVar30._4_4_ = cVar6;
  auVar30._0_4_ = cVar6;
  auVar30._8_4_ = cVar6;
  auVar30._12_4_ = cVar6;
  cVar6 = (wtrs0->m_basis).m_el[2].m_floats[2];
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar4)),auVar12,ZEXT416((uint)cVar5));
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar2)),auVar25,ZEXT416((uint)cVar5));
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar4)),auVar28,ZEXT416((uint)cVar5));
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(wtrs0->m_basis).m_el[0].m_floats;
  auVar15 = vfmadd231ss_fma(auVar17,auVar21,ZEXT416((uint)cVar6));
  auVar14 = vfmadd231ss_fma(auVar14,auVar27,ZEXT416((uint)cVar6));
  auVar23 = vfmadd231ss_fma(auVar23,auVar30,ZEXT416((uint)cVar6));
  uVar7 = *(undefined8 *)(wtrs0->m_basis).m_el[1].m_floats;
  fVar4 = (float)uVar7;
  auVar17._0_4_ = fVar1 * fVar4;
  fVar8 = (float)((ulong)uVar7 >> 0x20);
  auVar17._4_4_ = fVar1 * fVar8;
  auVar17._8_4_ = fVar1 * 0.0;
  auVar17._12_4_ = fVar1 * 0.0;
  auVar17 = vfmadd231ps_fma(auVar17,auVar16,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(wtrs0->m_basis).m_el[2].m_floats;
  auVar17 = vfmadd231ps_fma(auVar17,auVar13,auVar21);
  uVar7 = vmovlps_avx(auVar17);
  *(undefined8 *)(shape->m_toshape1).m_el[0].m_floats = uVar7;
  auVar18._0_4_ = fVar4 * fVar2;
  auVar18._4_4_ = fVar8 * fVar2;
  auVar18._8_4_ = fVar2 * 0.0;
  auVar18._12_4_ = fVar2 * 0.0;
  (shape->m_toshape1).m_el[0].m_floats[2] = auVar15._0_4_;
  (shape->m_toshape1).m_el[0].m_floats[3] = 0.0;
  auVar17 = vfmadd231ps_fma(auVar18,auVar16,auVar25);
  auVar17 = vfmadd231ps_fma(auVar17,auVar13,auVar27);
  uVar7 = vmovlps_avx(auVar17);
  *(undefined8 *)(shape->m_toshape1).m_el[1].m_floats = uVar7;
  auVar15._0_4_ = fVar3 * fVar4;
  auVar15._4_4_ = fVar3 * fVar8;
  auVar15._8_4_ = fVar3 * 0.0;
  auVar15._12_4_ = fVar3 * 0.0;
  (shape->m_toshape1).m_el[1].m_floats[2] = auVar14._0_4_;
  (shape->m_toshape1).m_el[1].m_floats[3] = 0.0;
  auVar17 = vfmadd231ps_fma(auVar15,auVar28,auVar16);
  auVar17 = vfmadd231ps_fma(auVar17,auVar30,auVar13);
  uVar7 = vmovlps_avx(auVar17);
  *(undefined8 *)(shape->m_toshape1).m_el[2].m_floats = uVar7;
  (shape->m_toshape1).m_el[2].m_floats[2] = auVar23._0_4_;
  (shape->m_toshape1).m_el[2].m_floats[3] = 0.0;
  fVar1 = (wtrs0->m_basis).m_el[1].m_floats[0];
  fVar2 = (wtrs0->m_basis).m_el[1].m_floats[1];
  fVar3 = (wtrs0->m_basis).m_el[1].m_floats[2];
  fVar4 = (wtrs1->m_basis).m_el[1].m_floats[2];
  cVar5 = (wtrs0->m_basis).m_el[0].m_floats[0];
  auVar22._4_4_ = cVar5;
  auVar22._0_4_ = cVar5;
  auVar22._8_4_ = cVar5;
  auVar22._12_4_ = cVar5;
  cVar5 = (wtrs0->m_basis).m_el[0].m_floats[1];
  auVar29._4_4_ = cVar5;
  auVar29._0_4_ = cVar5;
  auVar29._8_4_ = cVar5;
  auVar29._12_4_ = cVar5;
  cVar5 = (wtrs0->m_basis).m_el[0].m_floats[2];
  auVar32._4_4_ = cVar5;
  auVar32._0_4_ = cVar5;
  auVar32._8_4_ = cVar5;
  auVar32._12_4_ = cVar5;
  cVar5 = (wtrs1->m_basis).m_el[0].m_floats[2];
  cVar6 = (wtrs0->m_basis).m_el[2].m_floats[0];
  auVar24._4_4_ = cVar6;
  auVar24._0_4_ = cVar6;
  auVar24._8_4_ = cVar6;
  auVar24._12_4_ = cVar6;
  cVar6 = (wtrs0->m_basis).m_el[2].m_floats[1];
  auVar31._4_4_ = cVar6;
  auVar31._0_4_ = cVar6;
  auVar31._8_4_ = cVar6;
  auVar31._12_4_ = cVar6;
  auVar12 = vbroadcastss_avx512vl(ZEXT416((uint)(wtrs0->m_basis).m_el[2].m_floats[2]));
  cVar6 = (wtrs1->m_basis).m_el[2].m_floats[2];
  fVar8 = (wtrs1->m_origin).m_floats[1] - (wtrs0->m_origin).m_floats[1];
  fVar9 = (wtrs1->m_origin).m_floats[0] - (wtrs0->m_origin).m_floats[0];
  fVar10 = (wtrs1->m_origin).m_floats[2] - (wtrs0->m_origin).m_floats[2];
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar4)),auVar22,ZEXT416((uint)cVar5));
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar4)),auVar29,ZEXT416((uint)cVar5));
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar4)),auVar32,ZEXT416((uint)cVar5));
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar1)),auVar22,ZEXT416((uint)fVar9));
  auVar16 = vfmadd231ss_fma(auVar17,auVar24,ZEXT416((uint)cVar6));
  auVar18 = vfmadd231ss_fma(auVar14,auVar31,ZEXT416((uint)cVar6));
  auVar13 = vfmadd231ss_avx512f(auVar23,auVar12,ZEXT416((uint)cVar6));
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar8)),auVar29,ZEXT416((uint)fVar9));
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar8)),auVar32,ZEXT416((uint)fVar9));
  auVar23 = vfmadd231ss_fma(auVar15,auVar24,ZEXT416((uint)fVar10));
  auVar17 = vfmadd231ss_fma(auVar17,auVar31,ZEXT416((uint)fVar10));
  auVar14 = vfmadd231ss_avx512f(auVar14,auVar12,ZEXT416((uint)fVar10));
  uVar7 = *(undefined8 *)(wtrs1->m_basis).m_el[1].m_floats;
  auVar17 = vinsertps_avx(auVar23,auVar17,0x10);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(wtrs1->m_basis).m_el[0].m_floats;
  auVar17 = vinsertps_avx(auVar17,auVar14,0x28);
  fVar4 = (float)uVar7;
  auVar14._0_4_ = fVar1 * fVar4;
  fVar8 = (float)((ulong)uVar7 >> 0x20);
  auVar14._4_4_ = fVar1 * fVar8;
  auVar14._8_4_ = fVar1 * 0.0;
  auVar14._12_4_ = fVar1 * 0.0;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(wtrs1->m_basis).m_el[2].m_floats;
  auVar14 = vfmadd231ps_fma(auVar14,auVar26,auVar22);
  auVar23._0_4_ = fVar2 * fVar4;
  auVar23._4_4_ = fVar2 * fVar8;
  auVar23._8_4_ = fVar2 * 0.0;
  auVar23._12_4_ = fVar2 * 0.0;
  auVar19._0_4_ = fVar3 * fVar4;
  auVar19._4_4_ = fVar3 * fVar8;
  auVar19._8_4_ = fVar3 * 0.0;
  auVar19._12_4_ = fVar3 * 0.0;
  auVar23 = vfmadd231ps_fma(auVar23,auVar26,auVar29);
  auVar15 = vfmadd231ps_fma(auVar19,auVar32,auVar26);
  auVar14 = vfmadd231ps_fma(auVar14,auVar20,auVar24);
  auVar23 = vfmadd231ps_fma(auVar23,auVar20,auVar31);
  auVar15 = vfmadd231ps_avx512vl(auVar15,auVar12,auVar20);
  uVar7 = vmovlps_avx(auVar14);
  *(undefined8 *)(shape->m_toshape0).m_basis.m_el[0].m_floats = uVar7;
  (shape->m_toshape0).m_basis.m_el[0].m_floats[2] = auVar16._0_4_;
  (shape->m_toshape0).m_basis.m_el[0].m_floats[3] = 0.0;
  uVar7 = vmovlps_avx(auVar23);
  *(undefined8 *)(shape->m_toshape0).m_basis.m_el[1].m_floats = uVar7;
  (shape->m_toshape0).m_basis.m_el[1].m_floats[2] = auVar18._0_4_;
  (shape->m_toshape0).m_basis.m_el[1].m_floats[3] = 0.0;
  uVar7 = vmovlps_avx(auVar15);
  *(undefined8 *)(shape->m_toshape0).m_basis.m_el[2].m_floats = uVar7;
  (shape->m_toshape0).m_basis.m_el[2].m_floats[2] = auVar13._0_4_;
  (shape->m_toshape0).m_basis.m_el[2].m_floats[3] = 0.0;
  *(undefined1 (*) [16])(shape->m_toshape0).m_origin.m_floats = auVar17;
  if (withmargins) {
    pcVar11 = cbtConvexShape::localGetSupportVertexNonVirtual;
  }
  else {
    pcVar11 = cbtConvexShape::localGetSupportVertexWithoutMarginNonVirtual;
  }
  shape->Ls = (offset_in_cbtConvexShape_to_subr)pcVar11;
  *(undefined8 *)&shape->field_0x88 = 0;
  return;
}

Assistant:

static void Initialize(const cbtConvexShape* shape0, const cbtTransform& wtrs0,
					   const cbtConvexShape* shape1, const cbtTransform& wtrs1,
					   cbtGjkEpaSolver2::sResults& results,
					   tShape& shape,
					   bool withmargins)
{
	/* Results		*/
	results.witnesses[0] =
		results.witnesses[1] = cbtVector3(0, 0, 0);
	results.status = cbtGjkEpaSolver2::sResults::Separated;
	/* Shape		*/
	shape.m_shapes[0] = shape0;
	shape.m_shapes[1] = shape1;
	shape.m_toshape1 = wtrs1.getBasis().transposeTimes(wtrs0.getBasis());
	shape.m_toshape0 = wtrs0.inverseTimes(wtrs1);
	shape.EnableMargin(withmargins);
}